

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

bool __thiscall
tf::Executor::_invoke_runtime_task_impl
          (Executor *this,Worker *worker,Node *node,function<void_(tf::Runtime_&,_bool)> *work)

{
  Worker *in_RCX;
  Executor *in_RDX;
  Worker *in_RSI;
  Executor *in_RDI;
  Runtime rt;
  bool __args_1;
  Runtime *in_stack_ffffffffffffffa8;
  function<void_(tf::Runtime_&,_bool)> *in_stack_ffffffffffffffb0;
  bool in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  
  Runtime::Runtime((Runtime *)&stack0xffffffffffffffb8,in_RDI,in_RSI,(Node *)in_RDX);
  __args_1 = SUB81((ulong)in_RDI >> 0x38,0);
  if (((in_RDX->_taskflows_mutex).super___mutex_base._M_mutex.__data.__lock & 0x20000000U) == 0) {
    _observer_prologue(in_RDX,in_RCX,
                       (Node *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
    std::function<void_(tf::Runtime_&,_bool)>::operator()
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,__args_1);
    _observer_epilogue(in_RDX,in_RCX,
                       (Node *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
    if ((in_stack_ffffffffffffffd0 & 1U) != 0) {
      return true;
    }
  }
  else {
    (in_RDX->_taskflows_mutex).super___mutex_base._M_mutex.__data.__lock =
         (in_RDX->_taskflows_mutex).super___mutex_base._M_mutex.__data.__lock & 0xdfffffff;
  }
  std::function<void_(tf::Runtime_&,_bool)>::operator()
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,__args_1);
  return false;
}

Assistant:

inline bool Executor::_invoke_runtime_task_impl(
  Worker& worker, Node* node, std::function<void(Runtime&, bool)>& work
) {
    
  Runtime rt(*this, worker, node);

  // first time
  if((node->_nstate & NSTATE::PREEMPTED) == 0) {

    _observer_prologue(worker, node);
    TF_EXECUTOR_EXCEPTION_HANDLER(worker, node, {
      work(rt, false);
    });
    _observer_epilogue(worker, node);
    
    // here, we cannot check the state from node->_nstate due to data race
    // Ex: if preempted, another task may finish real quck and insert this parent task
    // again into the scheduling queue. When running this parent task, it will jump to
    // else branch below and modify tne nstate, thus incuring data race.
    if(rt._preempted) {
      return true;
    }
  }
  // second time - previously preempted
  else {
    node->_nstate &= ~NSTATE::PREEMPTED;
  }

  // clean up outstanding work
  work(rt, true);

  return false;
}